

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O1

string * __thiscall
slang::ast::EvalContext::dumpStack_abi_cxx11_(string *__return_storage_ptr__,EvalContext *this)

{
  size_type sVar1;
  SubroutineSymbol *pSVar2;
  long lVar3;
  pointer pFVar4;
  _Rb_tree_node_base *p_Var5;
  long lVar6;
  pointer pFVar7;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  FormatBuffer buffer;
  string local_2b8;
  long local_298;
  undefined8 local_290;
  char *local_288;
  size_t sStack_280;
  buffer<char> local_270;
  char local_250 [504];
  undefined1 local_58;
  
  local_270.ptr_ = local_250;
  local_270.size_ = 0;
  local_270._vptr_buffer = (_func_int **)&PTR_grow_004e96c0;
  local_270.capacity_ = 500;
  local_58 = 0;
  sVar1 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.len;
  if (sVar1 != 0) {
    pFVar7 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_;
    pFVar4 = pFVar7 + sVar1;
    lVar6 = 0;
    do {
      pSVar2 = pFVar7->subroutine;
      if (pSVar2 == (SubroutineSymbol *)0x0) {
        sStack_280 = 8;
        local_288 = "<global>";
      }
      else {
        sStack_280 = (pSVar2->super_Symbol).name._M_len;
        local_288 = (pSVar2->super_Symbol).name._M_str;
      }
      fmt.size_ = 7;
      fmt.data_ = "{}: {}\n";
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_298;
      args.desc_ = 0xd1;
      local_298 = lVar6;
      ::fmt::v9::detail::vformat_to<char>(&local_270,fmt,args,(locale_ref)0x0);
      for (p_Var5 = *(_Base_ptr *)
                     ((long)&(pFVar7->temporaries)._M_t._M_impl.super__Rb_tree_header._M_header +
                     0x10);
          (_Rb_tree_header *)p_Var5 != &(pFVar7->temporaries)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        lVar3 = *(long *)(p_Var5 + 1);
        ConstantValue::toString_abi_cxx11_(&local_2b8,(ConstantValue *)&p_Var5[1]._M_parent);
        local_290 = *(undefined8 *)(lVar3 + 8);
        local_298 = *(long *)(lVar3 + 0x10);
        local_288 = local_2b8._M_dataplus._M_p;
        sStack_280 = local_2b8._M_string_length;
        fmt_00.size_ = 0xc;
        fmt_00.data_ = "    {} = {}\n";
        args_00.field_1.values_ =
             (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_298;
        args_00.desc_ = 0xdd;
        ::fmt::v9::detail::vformat_to<char>(&local_270,fmt_00,args_00,(locale_ref)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
      }
      lVar6 = lVar6 + 1;
      pFVar7 = pFVar7 + 1;
    } while (pFVar7 != pFVar4);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_270.ptr_,local_270.ptr_ + local_270.size_);
  if (local_270.ptr_ != local_250) {
    operator_delete(local_270.ptr_,local_270.capacity_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EvalContext::dumpStack() const {
    FormatBuffer buffer;
    int index = 0;
    for (const Frame& frame : stack) {
        buffer.format("{}: {}\n", index++, frame.subroutine ? frame.subroutine->name : "<global>");
        for (auto& [symbol, value] : frame.temporaries)
            buffer.format("    {} = {}\n", symbol->name, value.toString());
    }
    return buffer.str();
}